

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walkWindowList(Walker *pWalker,Window *pList,int bOneOnly)

{
  int iVar1;
  int in_EDX;
  Walker *in_RSI;
  int rc;
  Window *pWin;
  Expr *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  
  while( true ) {
    if (in_RSI == (Walker *)0x0) {
      return 0;
    }
    iVar1 = sqlite3WalkExprList(in_RSI,(ExprList *)CONCAT44(0xaaaaaaaa,in_stack_ffffffffffffffd0));
    if (iVar1 != 0) {
      return 2;
    }
    iVar1 = sqlite3WalkExprList(in_RSI,(ExprList *)(ulong)in_stack_ffffffffffffffd0);
    if (iVar1 != 0) {
      return 2;
    }
    iVar1 = sqlite3WalkExpr((Walker *)(ulong)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (iVar1 != 0) break;
    iVar1 = sqlite3WalkExpr((Walker *)(ulong)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (iVar1 != 0) {
      return 2;
    }
    iVar1 = sqlite3WalkExpr((Walker *)(ulong)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (iVar1 != 0) {
      return 2;
    }
    if (in_EDX != 0) {
      return 0;
    }
    in_RSI = (Walker *)in_RSI[1].xSelectCallback;
  }
  return 2;
}

Assistant:

static int walkWindowList(Walker *pWalker, Window *pList, int bOneOnly){
  Window *pWin;
  for(pWin=pList; pWin; pWin=pWin->pNextWin){
    int rc;
    rc = sqlite3WalkExprList(pWalker, pWin->pOrderBy);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExprList(pWalker, pWin->pPartition);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExpr(pWalker, pWin->pFilter);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExpr(pWalker, pWin->pStart);
    if( rc ) return WRC_Abort;
    rc = sqlite3WalkExpr(pWalker, pWin->pEnd);
    if( rc ) return WRC_Abort;
    if( bOneOnly ) break;
  }
  return WRC_Continue;
}